

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.cpp
# Opt level: O1

Block * __thiscall
Js::CompoundString::BlockInfo::CopyBuffer
          (BlockInfo *this,void *buffer,CharCount usedCharLength,bool reserveMoreSpace,
          Recycler *recycler)

{
  char *addr;
  void *address;
  Block *pBVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  CharCount count;
  undefined4 *puVar5;
  Block *pBVar6;
  CharCount CVar7;
  
  if (buffer == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x178,"(buffer)","buffer");
    if (!bVar3) goto LAB_00b37b1f;
    *puVar5 = 0;
  }
  if (recycler == (Recycler *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x179,"(recycler)","recycler");
    if (!bVar3) {
LAB_00b37b1f:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  uVar4 = usedCharLength + (usedCharLength == 0);
  CVar7 = uVar4 + 7 & 0xfffffff8;
  if (uVar4 <= CVar7) {
    if (reserveMoreSpace) {
      CVar7 = GrowCharCapacity(CVar7);
    }
    bVar3 = ShouldAllocateBuffer(CVar7);
    if (bVar3) {
      AllocateBuffer(this,CVar7,recycler);
      this->charLength = usedCharLength;
      addr = (char *)(this->buffer).ptr;
      count = Block::PointerLengthFromCharLength(CVar7);
      Memory::Recycler::WBSetBitRange(addr,count);
      js_wmemcpy_s((char16 *)(this->buffer).ptr,(ulong)CVar7,(char16 *)buffer,(ulong)usedCharLength)
      ;
      address = (this->buffer).ptr;
      CVar7 = Block::PointerLengthFromCharLength(this->charLength);
      Memory::RecyclerWriteBarrierManager::WriteBarrier(address,(ulong)CVar7 << 3);
      pBVar6 = (Block *)0x0;
    }
    else {
      pBVar6 = Block::New(buffer,usedCharLength,reserveMoreSpace,recycler);
      pBVar1 = (pBVar6->bufferOwner).ptr;
      Memory::Recycler::WBSetBit((char *)this);
      (this->buffer).ptr = pBVar1 + 1;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(this);
      this->charLength = pBVar6->charLength;
      this->charCapacity = pBVar6->charCapacity;
    }
    return pBVar6;
  }
  ::Math::DefaultOverflowPolicy();
}

Assistant:

CompoundString::Block *CompoundString::BlockInfo::CopyBuffer(
        const void *const buffer,
        const CharCount usedCharLength,
        const bool reserveMoreSpace,
        Recycler *const recycler)
    {
        Assert(buffer);
        Assert(recycler);

        CharCount charCapacity = AlignCharCapacityForAllocation(usedCharLength);
        if(reserveMoreSpace)
            charCapacity = GrowCharCapacity(charCapacity);
        if(ShouldAllocateBuffer(charCapacity))
        {
            AllocateBuffer(charCapacity, recycler);
            charLength = usedCharLength;

            ArrayWriteBarrierVerifyBits(Block::Pointers(Chars()), Block::PointerLengthFromCharLength(charCapacity));
            js_wmemcpy_s(Chars(), charCapacity, (const char16*)(buffer), usedCharLength);
            // SWB: buffer may contain chars or pointers. Trigger write barrier for the whole buffer.
            ArrayWriteBarrier(Pointers(), PointerLength());
            return nullptr;
        }

        Block *const block = Block::New(buffer, usedCharLength, reserveMoreSpace, recycler);
        CopyFrom(block);
        return block;
    }